

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qchar.cpp
# Opt level: O2

bool QChar::isMark(char32_t ucs4)

{
  Properties *pPVar1;
  
  if (0x10ffff < (uint)ucs4) {
    return false;
  }
  pPVar1 = QUnicodeTables::qGetProp(ucs4);
  return (*(uint *)pPVar1 & 0x1f) < 3;
}

Assistant:

bool QChar::isMark(char32_t ucs4) noexcept
{
    if (ucs4 > LastValidCodePoint)
        return false;
    const int test = FLAG(Mark_NonSpacing) |
                     FLAG(Mark_SpacingCombining) |
                     FLAG(Mark_Enclosing);
    return FLAG(qGetProp(ucs4)->category) & test;
}